

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csnode_bmod.c
# Opt level: O2

int csnode_bmod(int jcol,int jsupno,int fsupc,singlecomplex *dense,singlecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  flops_t *pfVar4;
  int_t *piVar5;
  int_t *piVar6;
  void *pvVar7;
  int_t *piVar8;
  ulong uVar9;
  int ldm;
  ulong uVar10;
  uint nrow;
  long lVar11;
  int iVar12;
  singlecomplex *psVar13;
  
  pfVar4 = stat->ops;
  piVar5 = Glu->lsub;
  piVar6 = Glu->xlsub;
  pvVar7 = Glu->lusup;
  piVar8 = Glu->xlusup;
  uVar10 = (ulong)piVar8[jcol];
  psVar13 = (singlecomplex *)(uVar10 * 8 + (long)pvVar7);
  for (lVar11 = (long)piVar6[fsupc]; lVar11 < piVar6[(long)fsupc + 1]; lVar11 = lVar11 + 1) {
    iVar12 = piVar5[lVar11];
    *psVar13 = dense[iVar12];
    dense[iVar12].r = 0.0;
    dense[iVar12].i = 0.0;
    uVar10 = (ulong)((int)uVar10 + 1);
    psVar13 = psVar13 + 1;
  }
  piVar8[(long)jcol + 1] = (int)uVar10;
  iVar12 = jcol - fsupc;
  if (iVar12 != 0 && fsupc <= jcol) {
    iVar2 = piVar8[fsupc];
    ldm = piVar6[(long)fsupc + 1] - piVar6[fsupc];
    nrow = ldm - iVar12;
    iVar3 = piVar8[jcol];
    pfVar4[0x13] = (float)((iVar12 + -1) * iVar12 * 4) + pfVar4[0x13];
    pfVar4[0x14] = (float)(int)(iVar12 * nrow * 8) + pfVar4[0x14];
    psVar13 = (singlecomplex *)((long)pvVar7 + (long)iVar3 * 8);
    clsolve(ldm,iVar12,(singlecomplex *)((long)pvVar7 + (long)iVar2 * 8),psVar13);
    cmatvec(ldm,nrow,iVar12,(singlecomplex *)((long)pvVar7 + ((long)iVar2 + (long)iVar12) * 8),
            psVar13,tempv);
    iVar12 = iVar12 + iVar3;
    uVar9 = 0;
    uVar10 = (ulong)nrow;
    if ((int)nrow < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      uVar1 = *(undefined8 *)((long)pvVar7 + uVar9 * 8 + (long)iVar12 * 8);
      *(ulong *)((long)pvVar7 + uVar9 * 8 + (long)iVar12 * 8) =
           CONCAT44((float)((ulong)uVar1 >> 0x20) - tempv[uVar9].i,(float)uVar1 - tempv[uVar9].r);
      tempv[uVar9].r = 0.0;
      tempv[uVar9].i = 0.0;
    }
  }
  return 0;
}

Assistant:

int
csnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    singlecomplex     *dense,    /* in */
	    singlecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    singlecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    singlecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    singlecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}